

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenMemoryInitSetOffset(BinaryenExpressionRef expr,BinaryenExpressionRef offsetExpr)

{
  if (expr->_id != MemoryInitId) {
    __assert_fail("expression->is<MemoryInit>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0xda6,
                  "void BinaryenMemoryInitSetOffset(BinaryenExpressionRef, BinaryenExpressionRef)");
  }
  if (offsetExpr != (BinaryenExpressionRef)0x0) {
    expr[2].type.id = (uintptr_t)offsetExpr;
    return;
  }
  __assert_fail("offsetExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0xda7,
                "void BinaryenMemoryInitSetOffset(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenMemoryInitSetOffset(BinaryenExpressionRef expr,
                                 BinaryenExpressionRef offsetExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<MemoryInit>());
  assert(offsetExpr);
  static_cast<MemoryInit*>(expression)->offset = (Expression*)offsetExpr;
}